

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_NewEnumTest_Test::~TApp_NewEnumTest_Test(TApp_NewEnumTest_Test *this)

{
  TApp_NewEnumTest_Test *this_local;
  
  ~TApp_NewEnumTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, NewEnumTest) {
    enum class Level2 : std::int32_t { High, Medium, Low };
    Level2 level = Level2::Low;
    app.add_option("--level", level);

    args = {"--level", "1"};
    run();
    EXPECT_EQ(level, Level2::Medium);
}